

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_block_allocator.cpp
# Opt level: O2

void __thiscall
foxxll::disk_block_allocator::add_free_region
          (disk_block_allocator *this,uint64_t block_pos,uint64_t block_size)

{
  space_map_type *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator iVar3;
  iterator iVar4;
  iterator __position;
  iterator iVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  bad_ext_alloc *pbVar8;
  uint64_t uVar9;
  _Self __tmp;
  uint64_t region_pos;
  uint64_t local_1f0;
  iterator pred;
  iterator succ;
  string local_1c8;
  ostringstream msg;
  
  this_00 = &this->free_space_;
  uVar9 = block_size;
  region_pos = block_pos;
  iVar3._M_node = succ._M_node;
  if ((this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) goto LAB_00146ff6;
  local_1f0 = block_size;
  __position = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::upper_bound(&this_00->_M_t,&region_pos);
  p_Var2 = (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar5 = __position;
  succ._M_node = __position._M_node;
  if (__position._M_node != p_Var2) {
    pred._M_node = __position._M_node;
    iVar5._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
  }
  p_Var1 = &(this->free_space_)._M_t._M_impl.super__Rb_tree_header;
  pred._M_node = iVar5._M_node;
  if ((((_Rb_tree_header *)iVar5._M_node != p_Var1) && (*(ulong *)(iVar5._M_node + 1) <= region_pos)
      ) && (region_pos <
            (long)&(iVar5._M_node[1]._M_parent)->_M_color + *(ulong *)(iVar5._M_node + 1))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar7 = std::operator<<((ostream *)&msg,"Error in ");
    poVar7 = std::operator<<(poVar7,"disk_block_allocator::check_corruption");
    poVar7 = std::operator<<(poVar7," : ");
    poVar7 = std::operator<<(poVar7,
                             "Error: double deallocation of external memory, trying to deallocate region "
                            );
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," + ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," in empty space[");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," + ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7,"]");
    pbVar8 = (bad_ext_alloc *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    bad_ext_alloc::bad_ext_alloc(pbVar8,&local_1c8);
    __cxa_throw(pbVar8,&bad_ext_alloc::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar9 = local_1f0;
  block_size = local_1f0;
  iVar3._M_node = succ._M_node;
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    if (iVar5._M_node == __position._M_node) {
      deallocation_error(this,block_pos,local_1f0,&pred,&succ);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/mng/disk_block_allocator.cpp"
                    ,0x6a,"void foxxll::disk_block_allocator::add_free_region(uint64_t, uint64_t)");
    }
    if ((long)&(iVar5._M_node[1]._M_parent)->_M_color + *(uint64_t *)(iVar5._M_node + 1) !=
        region_pos) goto LAB_00146ff6;
    block_size = (long)&(iVar5._M_node[1]._M_parent)->_M_color + local_1f0;
    __position._M_node = iVar5._M_node;
    region_pos = *(uint64_t *)(iVar5._M_node + 1);
  }
  else {
    if (*(ulong *)(__position._M_node + 1) < region_pos + local_1f0 &&
        region_pos <= *(ulong *)(__position._M_node + 1)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      poVar7 = std::operator<<((ostream *)&msg,"Error in ");
      poVar7 = std::operator<<(poVar7,"disk_block_allocator::check_corruption");
      poVar7 = std::operator<<(poVar7," : ");
      poVar7 = std::operator<<(poVar7,
                               "Error: double deallocation of external memory, trying to deallocate region "
                              );
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7," + ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,"  which overlaps empty space [");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7," + ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar7,"]");
      pbVar8 = (bad_ext_alloc *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      bad_ext_alloc::bad_ext_alloc(pbVar8,&local_1c8);
      __cxa_throw(pbVar8,&bad_ext_alloc::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_node_count < 2) {
      if (*(long *)(__position._M_node + 1) != region_pos + local_1f0) goto LAB_00146ff6;
      block_size = (long)&(__position._M_node[1]._M_parent)->_M_color + local_1f0;
    }
    else {
      iVar4._M_node = succ._M_node;
      if (*(long *)(__position._M_node + 1) == region_pos + local_1f0) {
        block_size = (long)&(__position._M_node[1]._M_parent)->_M_color + local_1f0;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                            *)this_00,__position);
        uVar9 = local_1f0;
        iVar4._M_node = iVar5._M_node;
        iVar3 = succ;
      }
      succ._M_node = iVar4._M_node;
      local_1f0 = uVar9;
      if (__position._M_node == p_Var2) goto LAB_00146ff6;
      if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
        deallocation_error(this,block_pos,uVar9,&pred,&succ);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/mng/disk_block_allocator.cpp"
                      ,0x83,"void foxxll::disk_block_allocator::add_free_region(uint64_t, uint64_t)"
                     );
      }
      iVar3._M_node = succ._M_node;
      if ((long)&(iVar5._M_node[1]._M_parent)->_M_color + *(uint64_t *)(iVar5._M_node + 1) !=
          region_pos) goto LAB_00146ff6;
      block_size = (long)&(iVar5._M_node[1]._M_parent)->_M_color + block_size;
      __position._M_node = iVar5._M_node;
      region_pos = *(uint64_t *)(iVar5._M_node + 1);
    }
  }
  uVar9 = local_1f0;
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
  ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                      *)this_00,__position);
  iVar3 = succ;
LAB_00146ff6:
  succ._M_node = iVar3._M_node;
  pmVar6 = std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::operator[](this_00,&region_pos);
  *pmVar6 = block_size;
  this->free_bytes_ = this->free_bytes_ + uVar9;
  return;
}

Assistant:

void disk_block_allocator::add_free_region(uint64_t block_pos, uint64_t block_size)
{
    TLX_LOG << "Deallocating a block with size: " << block_size << " position: " << block_pos;
    uint64_t region_pos = block_pos;
    uint64_t region_size = block_size;

    // First we try to find adjacent free slots and if successful we coalesce them
    // During this procedure we also identify double-frees and similar issues
    if (!free_space_.empty())
    {
        auto succ = free_space_.upper_bound(region_pos);
        auto pred = succ;

        if (pred != free_space_.begin())
            pred--;

        if (pred != free_space_.end()) {
            if (pred->first <= region_pos && (pred->first + pred->second) > region_pos) {
                FOXXLL_THROW2(
                    bad_ext_alloc, "disk_block_allocator::check_corruption",
                    "Error: double deallocation of external memory, trying to deallocate "
                    "region " << region_pos << " + " << region_size << " in empty space"
                        "[" << pred->first << " + " << pred->second << "]"
                );
            }
        }

        if (succ != free_space_.end()) {
            if (region_pos <= succ->first && (region_pos + region_size) > succ->first) {
                FOXXLL_THROW2(
                    bad_ext_alloc, "disk_block_allocator::check_corruption",
                    "Error: double deallocation of external memory, trying to deallocate "
                    "region " << region_pos << " + " << region_size << "  which overlaps empty space "
                        "[" << succ->first << " + " << succ->second << "]"
                );
            }
        }

        if (succ == free_space_.end()) {
            if (pred == free_space_.end()) {
                deallocation_error(block_pos, block_size, pred, succ);
                assert(false);
            }
            else if ((*pred).first + (*pred).second == region_pos) {
                // coalesce with predecessor
                region_size += (*pred).second;
                region_pos = (*pred).first;
                free_space_.erase(pred);
            }
        }
        else {
            if (free_space_.size() > 1) {
                // check it now, as succ may change!
                const bool succ_is_not_the_first = (succ != free_space_.begin());

                if ((*succ).first == region_pos + region_size) {
                    // coalesce with successor
                    region_size += (*succ).second;
                    free_space_.erase(succ);
                    if (succ_is_not_the_first)
                        succ = pred;
                }

                if (succ_is_not_the_first) {
                    if (pred == free_space_.end()) {
                        deallocation_error(block_pos, block_size, pred, succ);
                        assert(false);
                    }
                    else if ((*pred).first + (*pred).second == region_pos) {
                        // coalesce with predecessor
                        region_size += (*pred).second;
                        region_pos = (*pred).first;
                        free_space_.erase(pred);
                    }
                }
            }
            else {
                if ((*succ).first == region_pos + region_size) {
                    // coalesce with successor
                    region_size += (*succ).second;
                    free_space_.erase(succ);
                }
            }
        }
    }

    free_space_[region_pos] = region_size;
    free_bytes_ += block_size;
}